

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O2

int obudec_read_temporal_unit
              (ObuDecInputContext *obu_ctx,uint8_t **buffer,size_t *bytes_read,size_t *buffer_size)

{
  uint8_t **obu_buffer;
  AvxInputContext *pAVar1;
  _Bool _Var2;
  int iVar3;
  uint8_t *puVar4;
  size_t sVar5;
  ulong uVar6;
  char *__ptr;
  undefined1 buffered;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  size_t length_of_temporal_unit_size;
  size_t bytes_read_1;
  size_t *local_80;
  size_t local_78;
  uint8_t tuheader [8];
  ObuHeader obu_header;
  size_t *bytes_read_00;
  
  pAVar1 = obu_ctx->avx_ctx;
  if (pAVar1->file == (FILE *)0x0) {
    return -1;
  }
  *buffer_size = 0;
  *bytes_read = 0;
  _Var2 = input_eof(pAVar1);
  if (_Var2) {
    return 1;
  }
  length_of_temporal_unit_size = 0;
  tuheader[0] = '\0';
  tuheader[1] = '\0';
  tuheader[2] = '\0';
  tuheader[3] = '\0';
  tuheader[4] = '\0';
  tuheader[5] = '\0';
  tuheader[6] = '\0';
  tuheader[7] = '\0';
  if (obu_ctx->is_annexb == 0) {
    obu_buffer = &obu_ctx->buffer;
    local_80 = &obu_ctx->buffer_capacity;
    sVar7 = obu_ctx->bytes_buffered;
    while( true ) {
      obu_header.has_extension = 0;
      obu_header.temporal_layer_id = 0;
      obu_header.spatial_layer_id = 0;
      obu_header._28_4_ = 0;
      obu_header.size = 0;
      obu_header.type = 0;
      obu_header._9_3_ = 0;
      obu_header.has_size_field = 0;
      pAVar1 = obu_ctx->avx_ctx;
      if ((pAVar1 == (AvxInputContext *)0x0) || (puVar4 = *obu_buffer, puVar4 == (uint8_t *)0x0))
      goto LAB_00122727;
      bytes_read_1 = 0;
      local_78 = 0;
      uVar8 = *local_80;
      uVar6 = uVar8 - sVar7;
      if (uVar6 < 0x12) {
        if (uVar8 < 0x13) {
          uVar8 = 0x12;
        }
        iVar3 = obudec_grow_buffer(uVar8,obu_buffer,local_80);
        if (iVar3 != 0) goto LAB_00122727;
        uVar8 = *local_80;
        if (*local_80 < 0x13) {
          uVar8 = 0x12;
        }
        uVar6 = uVar6 + uVar8;
        puVar4 = *obu_buffer;
      }
      bytes_read_00 = &bytes_read_1;
      iVar3 = obudec_read_obu_header_and_size
                        (pAVar1,uVar6,0,puVar4 + sVar7,bytes_read_00,&local_78,&obu_header,false);
      buffered = SUB81(bytes_read_00,0);
      if ((iVar3 < 0) || (CARRY8(bytes_read_1,local_78))) goto LAB_00122727;
      if (0x10000000 < local_78) break;
      if (uVar6 < bytes_read_1 + local_78) {
        sVar5 = local_78;
        if (local_78 < *local_80) {
          sVar5 = *local_80;
        }
        iVar3 = obudec_grow_buffer(sVar5,obu_buffer,local_80);
        if (iVar3 != 0) goto LAB_00122727;
      }
      if ((local_78 != 0) &&
         (iVar3 = obudec_read_obu_payload
                            (pAVar1,local_78,*obu_buffer + bytes_read_1 + sVar7,&bytes_read_1,
                             (_Bool)buffered), iVar3 != 0)) goto LAB_00122727;
      uVar8 = obu_ctx->bytes_buffered;
      if ((obu_header.type == OBU_TEMPORAL_DELIMITER) || (bytes_read_1 == 0)) {
        sVar9 = bytes_read_1;
        if (uVar8 < 0x200000001) goto LAB_001225cf;
        __ptr = "obudec: Temporal Unit size exceeds max alloc size.\n";
        sVar9 = 0x33;
        goto LAB_0012273a;
      }
      sVar7 = uVar8 + bytes_read_1;
      obu_ctx->bytes_buffered = sVar7;
    }
    fprintf(_stderr,"obudec: Read invalid OBU size (%u)\n",local_78 & 0xffffffff);
LAB_00122727:
    __ptr = "obudec: read_one_obu failed in TU loop\n";
    sVar9 = 0x27;
    goto LAB_0012273a;
  }
  obu_header.size = 0;
  if (obu_ctx->bytes_buffered == 0) {
    iVar3 = obudec_read_leb128(obu_ctx->avx_ctx,tuheader,&length_of_temporal_unit_size,
                               &obu_header.size,false);
    if (iVar3 != 0) goto LAB_001226db;
    if ((obu_header.size == 0) && (_Var2 = input_eof(obu_ctx->avx_ctx), _Var2)) {
      return 1;
    }
  }
  else {
    iVar3 = aom_uleb_decode(obu_ctx->buffer,obu_ctx->bytes_buffered,&obu_header.size,
                            &length_of_temporal_unit_size);
    if (iVar3 != 0) {
LAB_001226db:
      __ptr = "obudec: Failure reading temporal unit header\n";
      sVar9 = 0x2d;
      goto LAB_0012273a;
    }
  }
  if ((obu_header.size >> 0x20 == 0) &&
     (uVar8 = obu_header.size + length_of_temporal_unit_size, uVar8 >> 0x20 == 0)) {
    sVar9 = 0;
LAB_001225cf:
    if (uVar8 != 0) {
      puVar4 = (uint8_t *)realloc(*buffer,uVar8);
      if (puVar4 == (uint8_t *)0x0) {
        free(*buffer);
        __ptr = "obudec: Out of memory.\n";
        sVar9 = 0x17;
        goto LAB_0012273a;
      }
      *buffer = puVar4;
    }
    *bytes_read = uVar8;
    *buffer_size = uVar8;
    if (obu_ctx->is_annexb == 0) {
      memcpy(*buffer,obu_ctx->buffer,uVar8);
      memmove(obu_ctx->buffer,obu_ctx->buffer + obu_ctx->bytes_buffered,sVar9);
      obu_ctx->bytes_buffered = sVar9;
      return 0;
    }
    _Var2 = input_eof(obu_ctx->avx_ctx);
    sVar7 = length_of_temporal_unit_size;
    if (_Var2) {
      return 0;
    }
    uVar6 = obu_ctx->bytes_buffered;
    if (uVar6 == 0) {
      memcpy(*buffer,tuheader,length_of_temporal_unit_size);
      sVar9 = length_of_temporal_unit_size;
    }
    else {
      sVar7 = uVar6;
      if (uVar8 <= uVar6) {
        sVar7 = uVar8;
      }
      memcpy(*buffer,obu_ctx->buffer,sVar7);
      obu_ctx->bytes_buffered = obu_ctx->bytes_buffered - sVar7;
      sVar9 = sVar7;
    }
    sVar5 = read_from_input(obu_ctx->avx_ctx,uVar8 - sVar7,*buffer + sVar9);
    if (sVar5 == uVar8 - sVar7) {
      return 0;
    }
    __ptr = "obudec: Failed to read full temporal unit\n";
    sVar9 = 0x2a;
  }
  else {
    __ptr = "obudec: TU too large.\n";
    sVar9 = 0x16;
  }
LAB_0012273a:
  fwrite(__ptr,sVar9,1,_stderr);
  return -1;
}

Assistant:

int obudec_read_temporal_unit(struct ObuDecInputContext *obu_ctx,
                              uint8_t **buffer, size_t *bytes_read,
                              size_t *buffer_size) {
  FILE *f = obu_ctx->avx_ctx->file;
  if (!f) return -1;

  *buffer_size = 0;
  *bytes_read = 0;

  if (input_eof(obu_ctx->avx_ctx)) {
    return 1;
  }

  size_t tu_size;
  size_t obu_size = 0;
  size_t length_of_temporal_unit_size = 0;
  uint8_t tuheader[OBU_MAX_LENGTH_FIELD_SIZE] = { 0 };

  if (obu_ctx->is_annexb) {
    uint64_t size = 0;

    if (obu_ctx->bytes_buffered == 0) {
      if (obudec_read_leb128(obu_ctx->avx_ctx, &tuheader[0],
                             &length_of_temporal_unit_size, &size,
                             /*buffered=*/false) != 0) {
        fprintf(stderr, "obudec: Failure reading temporal unit header\n");
        return -1;
      }
      if (size == 0 && input_eof(obu_ctx->avx_ctx)) {
        return 1;
      }
    } else {
      // temporal unit size was already stored in buffer
      if (aom_uleb_decode(obu_ctx->buffer, obu_ctx->bytes_buffered, &size,
                          &length_of_temporal_unit_size) != 0) {
        fprintf(stderr, "obudec: Failure reading temporal unit header\n");
        return -1;
      }
    }

    if (size > UINT32_MAX || size + length_of_temporal_unit_size > UINT32_MAX) {
      fprintf(stderr, "obudec: TU too large.\n");
      return -1;
    }

    size += length_of_temporal_unit_size;
    tu_size = (size_t)size;
  } else {
    while (1) {
      ObuHeader obu_header;
      memset(&obu_header, 0, sizeof(obu_header));

      if (obudec_read_one_obu(obu_ctx->avx_ctx, &obu_ctx->buffer,
                              obu_ctx->bytes_buffered,
                              &obu_ctx->buffer_capacity, &obu_size, &obu_header,
                              0, /*buffered=*/false) != 0) {
        fprintf(stderr, "obudec: read_one_obu failed in TU loop\n");
        return -1;
      }

      if (obu_header.type == OBU_TEMPORAL_DELIMITER || obu_size == 0) {
        tu_size = obu_ctx->bytes_buffered;
        break;
      } else {
        obu_ctx->bytes_buffered += obu_size;
      }
    }
  }

#if defined AOM_MAX_ALLOCABLE_MEMORY
  if (tu_size > AOM_MAX_ALLOCABLE_MEMORY) {
    fprintf(stderr, "obudec: Temporal Unit size exceeds max alloc size.\n");
    return -1;
  }
#endif
  if (tu_size > 0) {
    uint8_t *new_buffer = (uint8_t *)realloc(*buffer, tu_size);
    if (!new_buffer) {
      free(*buffer);
      fprintf(stderr, "obudec: Out of memory.\n");
      return -1;
    }
    *buffer = new_buffer;
  }
  *bytes_read = tu_size;
  *buffer_size = tu_size;

  if (!obu_ctx->is_annexb) {
    memcpy(*buffer, obu_ctx->buffer, tu_size);

    // At this point, (obu_ctx->buffer + obu_ctx->bytes_buffered + obu_size)
    // points to the end of the buffer.
    memmove(obu_ctx->buffer, obu_ctx->buffer + obu_ctx->bytes_buffered,
            obu_size);
    obu_ctx->bytes_buffered = obu_size;
  } else {
    if (!input_eof(obu_ctx->avx_ctx)) {
      size_t data_size;
      size_t offset;
      if (!obu_ctx->bytes_buffered) {
        data_size = tu_size - length_of_temporal_unit_size;
        memcpy(*buffer, &tuheader[0], length_of_temporal_unit_size);
        offset = length_of_temporal_unit_size;
      } else {
        const size_t copy_size = AOMMIN(obu_ctx->bytes_buffered, tu_size);
        memcpy(*buffer, obu_ctx->buffer, copy_size);
        offset = copy_size;
        data_size = tu_size - copy_size;
        obu_ctx->bytes_buffered -= copy_size;
      }

      if (read_from_input(obu_ctx->avx_ctx, data_size, *buffer + offset) !=
          data_size) {
        fprintf(stderr, "obudec: Failed to read full temporal unit\n");
        return -1;
      }
    }
  }
  return 0;
}